

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmElfRelocator.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
ArmElfRelocator::generateCtorStub
          (ArmElfRelocator *this,vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *ctors)

{
  long lVar1;
  char *args;
  long *in_RDX;
  long lVar2;
  long lVar3;
  string *this_00;
  unsigned_long *in_R9;
  size_t i;
  ulong uVar4;
  initializer_list<AssemblyTemplateArgument> variables;
  initializer_list<AssemblyTemplateArgument> variables_00;
  allocator<char> local_2d2;
  allocator<char> local_2d1;
  char *local_2d0;
  __uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_2c8;
  string table;
  Identifier local_2a0;
  Identifier local_280;
  Identifier local_260;
  unsigned_long local_240;
  Identifier local_238;
  undefined1 local_218 [32];
  undefined1 local_1f8 [40];
  char *local_1d0;
  string local_1c8;
  char *local_1a8;
  string local_1a0 [32];
  char *local_180;
  string local_178 [32];
  char *local_158;
  string local_150 [32];
  char *local_130;
  string local_128 [32];
  char *local_108;
  string local_100 [32];
  Parser parser;
  
  Parser::Parser(&parser);
  lVar3 = *in_RDX;
  lVar1 = in_RDX[1];
  if (lVar1 == lVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f8,"bx r14",(allocator<char> *)&table);
    variables_00._M_len = 0;
    variables_00._M_array = (iterator)local_1f8;
    Parser::parseTemplate((Parser *)this,(string *)&parser,variables_00);
    this_00 = (string *)local_1f8;
  }
  else {
    local_2d0 = "1";
    if ((Arm.thumb & 1U) == 0) {
      local_2d0 = "0";
    }
    if (*(char *)&(ctors->super__Vector_base<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>).
                  _M_impl.super__Vector_impl_data._M_finish != '\0') {
      local_2d0 = "0";
    }
    table._M_dataplus._M_p = (pointer)&table.field_2;
    table._M_string_length = 0;
    table.field_2._M_local_buf[0] = '\0';
    lVar2 = 0x20;
    local_2c8._M_t.
    super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
    super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl =
         (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
         (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)this;
    for (uVar4 = 0; uVar4 < (ulong)((lVar1 - lVar3) / 0x28); uVar4 = uVar4 + 1) {
      if (uVar4 != 0) {
        std::__cxx11::string::push_back((char)&table);
        lVar3 = *in_RDX;
      }
      args = (char *)(lVar3 + lVar2 + -0x20);
      tinyformat::format<Identifier,Identifier,unsigned_long>
                ((string *)local_1f8,(tinyformat *)"%s,%s+0x%08X",args,(Identifier *)args,
                 (Identifier *)(lVar3 + lVar2),in_R9);
      std::__cxx11::string::append((string *)&table);
      std::__cxx11::string::~string((string *)local_1f8);
      lVar3 = *in_RDX;
      lVar1 = in_RDX[1];
      lVar2 = lVar2 + 0x28;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_218,ctorTemplate,&local_2d1);
    local_1f8._0_8_ = "%ctorTable%";
    SymbolTable::getUniqueLabelName(&local_238,&Global.symbolTable,false);
    std::__cxx11::string::string((string *)(local_1f8 + 8),(string *)&local_238);
    local_1d0 = "%ctorTableSize%";
    local_240 = (in_RDX[1] - *in_RDX) / 0x28 << 3;
    tinyformat::format<unsigned_long>(&local_1c8,"%d",&local_240);
    local_1a8 = "%outerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_260,&Global.symbolTable,false);
    std::__cxx11::string::string(local_1a0,(string *)&local_260);
    local_180 = "%innerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_280,&Global.symbolTable,false);
    std::__cxx11::string::string(local_178,(string *)&local_280);
    local_158 = "%stubName%";
    SymbolTable::getUniqueLabelName(&local_2a0,&Global.symbolTable,false);
    std::__cxx11::string::string(local_150,(string *)&local_2a0);
    this = (ArmElfRelocator *)
           local_2c8._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
    local_130 = "%simpleMode%";
    std::__cxx11::string::string<std::allocator<char>>(local_128,local_2d0,&local_2d2);
    local_108 = "%ctorContent%";
    std::__cxx11::string::string(local_100,(string *)&table);
    variables._M_len = (size_type)local_1f8;
    variables._M_array = (iterator)local_218;
    Parser::parseTemplate((Parser *)this,(string *)&parser,variables);
    lVar3 = 0xf8;
    do {
      std::__cxx11::string::~string((string *)(local_1f8 + lVar3));
      lVar3 = lVar3 + -0x28;
    } while (lVar3 != -0x20);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_218);
    this_00 = &table;
  }
  std::__cxx11::string::~string((string *)this_00);
  Parser::~Parser(&parser);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> ArmElfRelocator::generateCtorStub(std::vector<ElfRelocatorCtor>& ctors)
{
	Parser parser;
	if (ctors.size() != 0)
	{
		bool simpleMode = arm9 == false && Arm.GetThumbMode();

		// create constructor table
		std::string table;
		for (size_t i = 0; i < ctors.size(); i++)
		{
			if (i != 0)
				table += ',';
			table += tfm::format("%s,%s+0x%08X",ctors[i].symbolName,ctors[i].symbolName,ctors[i].size);
		}

		return parser.parseTemplate(ctorTemplate,{
			{ "%ctorTable%",		Global.symbolTable.getUniqueLabelName().string() },
			{ "%ctorTableSize%",	tfm::format("%d",ctors.size()*8) },
			{ "%outerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%innerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%stubName%",		Global.symbolTable.getUniqueLabelName().string() },
			{ "%simpleMode%",		simpleMode ? "1" : "0" },
			{ "%ctorContent%",		table },
		});
	} else {
		return parser.parseTemplate("bx r14");
	}
}